

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

intptr_t fio_socket(char *address,char *port,uint8_t server)

{
  undefined1 *puVar1;
  char cVar2;
  undefined1 uVar3;
  uint uVar4;
  fio_data_s *pfVar5;
  long lVar6;
  int __fd;
  uint uVar7;
  int iVar8;
  int64_t iVar9;
  intptr_t iVar10;
  int *piVar11;
  size_t sVar12;
  undefined7 in_register_00000011;
  ulong uVar13;
  char *pcVar14;
  char *pos;
  timespec local_d8;
  long local_c8;
  undefined4 local_bc;
  void *local_b8;
  long local_b0;
  size_t local_a8;
  undefined1 local_a0 [18];
  undefined8 local_8e;
  undefined8 uStack_86;
  undefined8 local_7e;
  undefined8 uStack_76;
  undefined8 local_6e;
  undefined8 uStack_66;
  undefined8 local_5e;
  undefined8 uStack_56;
  undefined8 uStack_4e;
  undefined4 uStack_46;
  undefined4 local_42;
  undefined4 uStack_3e;
  undefined8 uStack_3a;
  
  if (port == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    local_a0._0_2_ = SUB82(port,0);
    local_a0._2_6_ = (undefined6)((ulong)port >> 0x10);
    iVar9 = fio_atol((char **)local_a0);
    if (*(char *)CONCAT62(local_a0._2_6_,local_a0._0_2_) != '\0') {
      if (1 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR("ERROR: (fio_socket) port %s is not a number.",port);
      }
      goto LAB_001079c9;
    }
    pcVar14 = port;
    if (((iVar9 < 1) && (pcVar14 = (char *)0x0, iVar9 < -1)) && (2 < FIO_LOG_LEVEL)) {
      FIO_LOG2STDERR("WARNING: (fio_socket) negative port number %s is ignored.",port);
      pcVar14 = (char *)0x0;
    }
  }
  if (address != (char *)0x0 || pcVar14 != (char *)0x0) {
    piVar11 = __errno_location();
    if (pcVar14 != (char *)0x0) {
      *piVar11 = 0;
      while (iVar10 = fio_tcp_socket(address,pcVar14,server), *piVar11 == 4) {
        *piVar11 = 0;
      }
      return iVar10;
    }
    local_bc = (undefined4)CONCAT71(in_register_00000011,server);
    do {
      *piVar11 = 0;
      uStack_3e = 0;
      uStack_3a = 0;
      uStack_4e = 0;
      uStack_46 = 0;
      local_42 = 0;
      local_5e = 0;
      uStack_56 = 0;
      local_6e = 0;
      uStack_66 = 0;
      local_7e = 0;
      uStack_76 = 0;
      local_8e = 0;
      uStack_86 = 0;
      local_a0[2] = '\0';
      local_a0[3] = '\0';
      local_a0[4] = '\0';
      local_a0[5] = '\0';
      local_a0[6] = '\0';
      local_a0[7] = '\0';
      local_a0[8] = '\0';
      local_a0[9] = '\0';
      local_a0._10_8_ = 0;
      sVar12 = strlen(address);
      if (sVar12 < 0x6c) {
        local_a0._0_2_ = 1;
        local_a8 = sVar12 + 1;
        memcpy(local_a0 + 2,address,local_a8);
        __fd = socket(1,1,0);
        uVar13 = 0xffffffffffffffff;
        if (__fd != -1) {
          uVar7 = fcntl(__fd,3,0);
          uVar4 = uVar7 | 0x80800;
          if (uVar7 == 0xffffffff) {
            uVar4 = 0x80800;
          }
          iVar8 = fcntl(__fd,4,(ulong)uVar4);
          if (iVar8 != -1) {
            if ((char)local_bc == '\0') {
              iVar8 = connect(__fd,(sockaddr *)local_a0,0x6e);
              if ((iVar8 != -1) || (*piVar11 == 0x73)) goto LAB_00107b40;
            }
            else {
              unlink(local_a0 + 2);
              iVar8 = bind(__fd,(sockaddr *)local_a0,0x6e);
              if ((iVar8 != -1) && (iVar8 = listen(__fd,0x1000), -1 < iVar8)) {
                fchmod(__fd,0x1ff);
LAB_00107b40:
                pfVar5 = fio_data;
                local_b0 = (long)__fd;
                local_c8 = local_b0 * 0xa8;
                LOCK();
                pcVar14 = (char *)((long)fio_data + local_c8 + 0x6c);
                cVar2 = *pcVar14;
                *pcVar14 = '\x01';
                UNLOCK();
                local_d8.tv_sec._0_1_ = cVar2;
                if (cVar2 != '\0') {
                  pcVar14 = (char *)((long)pfVar5 + local_c8 + 0x6c);
                  do {
                    local_d8.tv_sec = 0;
                    local_d8.tv_nsec = 1;
                    nanosleep(&local_d8,(timespec *)0x0);
                    LOCK();
                    cVar2 = *pcVar14;
                    *pcVar14 = '\x01';
                    UNLOCK();
                    local_d8.tv_sec._0_1_ = cVar2;
                  } while (cVar2 != '\0');
                }
                lVar6 = local_b0;
                fio_clear_fd(local_b0,'\x01');
                LOCK();
                puVar1 = (undefined1 *)((long)&fio_data[1].thread_ids.obj + local_c8 + 4);
                uVar3 = *puVar1;
                *puVar1 = 0;
                pfVar5 = fio_data;
                UNLOCK();
                local_d8.tv_sec = CONCAT71(local_d8.tv_sec._1_7_,uVar3);
                if (sVar12 < 0x30) {
                  local_b8 = (void *)((long)&fio_data[1].threads + local_c8);
                  memcpy(local_b8,address,local_a8);
                  *(char *)((long)local_b8 + -1) = (char)sVar12;
                }
                uVar13 = (ulong)*(byte *)((long)&pfVar5[1].thread_ids.obj + local_c8 + 5) |
                         lVar6 << 8;
                goto LAB_00107c13;
              }
            }
          }
          close(__fd);
        }
      }
      else {
        if (1 < FIO_LOG_LEVEL) {
          FIO_LOG2STDERR("ERROR: (fio_unix_socket) address too long (%zu bytes > %zu bytes).",sVar12
                         ,0x6b);
        }
        *piVar11 = 0x24;
        uVar13 = 0xffffffffffffffff;
      }
LAB_00107c13:
      if (*piVar11 != 4) {
        return uVar13;
      }
    } while( true );
  }
  if (1 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR("ERROR: (fio_socket) both address and port are missing or invalid.");
  }
LAB_001079c9:
  piVar11 = __errno_location();
  *piVar11 = 0x16;
  return -1;
}

Assistant:

intptr_t fio_socket(const char *address, const char *port, uint8_t server) {
  intptr_t uuid;
  if (port) {
    char *pos = (char *)port;
    int64_t n = fio_atol(&pos);
    /* make sure port is only numerical */
    if (*pos) {
      FIO_LOG_ERROR("(fio_socket) port %s is not a number.", port);
      errno = EINVAL;
      return -1;
    }
    /* a negative port number will revert to a Unix socket. */
    if (n <= 0) {
      if (n < -1)
        FIO_LOG_WARNING("(fio_socket) negative port number %s is ignored.",
                        port);
      port = NULL;
    }
  }
  if (!address && !port) {
    FIO_LOG_ERROR("(fio_socket) both address and port are missing or invalid.");
    errno = EINVAL;
    return -1;
  }
  if (!port) {
    do {
      errno = 0;
      uuid = fio_unix_socket(address, server);
    } while (errno == EINTR);
  } else {
    do {
      errno = 0;
      uuid = fio_tcp_socket(address, port, server);
    } while (errno == EINTR);
  }
  return uuid;
}